

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

float __thiscall QString::toFloat(QString *this,bool *ok)

{
  bool *in_RSI;
  QString *in_RDI;
  float fVar1;
  bool *in_stack_ffffffffffffffe8;
  
  toDouble(in_RDI,in_RSI);
  fVar1 = QLocaleData::convertDoubleToFloat((double)in_RSI,in_stack_ffffffffffffffe8);
  return fVar1;
}

Assistant:

float QString::toFloat(bool *ok) const
{
    return QLocaleData::convertDoubleToFloat(toDouble(ok), ok);
}